

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_ObjSetCi(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Wlc_Obj_t *pWVar3;
  int local_24;
  int i;
  Wlc_Obj_t *pTemp;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_ObjIsCi(pObj);
  if (iVar1 == 0) {
    __assert_fail("Wlc_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                  ,0xaa,"void Wlc_ObjSetCi(Wlc_Ntk_t *, Wlc_Obj_t *)");
  }
  iVar1 = Wlc_ObjFaninNum(pObj);
  if (iVar1 == 0) {
    iVar1 = Wlc_NtkPiNum(p);
    iVar2 = Wlc_NtkCiNum(p);
    if ((iVar1 == iVar2) ||
       ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x1)) {
      iVar1 = Vec_IntSize(&p->vCis);
      (pObj->field_10).Fanins[1] = iVar1;
      iVar1 = Wlc_ObjId(p,pObj);
      Vec_IntPush(&p->vCis,iVar1);
    }
    else {
      iVar1 = Wlc_NtkPiNum(p);
      iVar2 = Wlc_ObjId(p,pObj);
      Vec_IntInsert(&p->vCis,iVar1,iVar2);
      for (local_24 = 0; iVar1 = Wlc_NtkCiNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
        pWVar3 = Wlc_NtkCi(p,local_24);
        (pWVar3->field_10).Fanins[1] = local_24;
      }
    }
    if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x1) {
      iVar1 = Wlc_ObjId(p,pObj);
      Vec_IntPush(&p->vPis,iVar1);
    }
    return;
  }
  __assert_fail("Wlc_ObjFaninNum(pObj) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                ,0xab,"void Wlc_ObjSetCi(Wlc_Ntk_t *, Wlc_Obj_t *)");
}

Assistant:

void Wlc_ObjSetCi( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    assert( Wlc_ObjIsCi(pObj) );
    assert( Wlc_ObjFaninNum(pObj) == 0 );
    if ( Wlc_NtkPiNum(p) == Wlc_NtkCiNum(p) || pObj->Type != WLC_OBJ_PI )
    {
        pObj->Fanins[1] = Vec_IntSize(&p->vCis);
        Vec_IntPush( &p->vCis, Wlc_ObjId(p, pObj) );
    }
    else // insert in the array of CI at the end of PIs
    {
        Wlc_Obj_t * pTemp; int i;
        Vec_IntInsert( &p->vCis, Wlc_NtkPiNum(p), Wlc_ObjId(p, pObj) );
        // other CI IDs are invalidated... naive fix!
        Wlc_NtkForEachCi( p, pTemp, i )
            pTemp->Fanins[1] = i;
    }
    if ( pObj->Type == WLC_OBJ_PI )
        Vec_IntPush( &p->vPis, Wlc_ObjId(p, pObj) );
}